

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::OptionParser::parseIntoConfig(OptionParser *this,CommandParser *parser,ConfigData *config)

{
  type tVar1;
  undefined1 local_58 [8];
  Command cmd;
  ConfigData *config_local;
  CommandParser *parser_local;
  OptionParser *this_local;
  
  cmd.m_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &config->reporter;
  find((Command *)local_58,this,parser);
  tVar1 = Command::operator_cast_to_function_pointer((Command *)local_58);
  if (tVar1 != 0) {
    validateArgs(this,(Command *)local_58);
    (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[4])
              (this,local_58,
               cmd.m_args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  Command::~Command((Command *)local_58);
  return;
}

Assistant:

void parseIntoConfig( const CommandParser& parser, ConfigData& config ) {
            if( Command cmd = find( parser ) ) {
                validateArgs( cmd );
                parseIntoConfig( cmd, config );
            }
        }